

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<double,duckdb::uhugeint_t>
          (BaseAppender *this,Vector *col,double input)

{
  uhugeint_t *puVar1;
  idx_t iVar2;
  long in_RDI;
  uhugeint_t uVar3;
  double unaff_retaddr;
  uint64_t local_28;
  uint64_t local_20;
  
  uVar3 = Cast::Operation<double,duckdb::uhugeint_t>(unaff_retaddr);
  puVar1 = FlatVector::GetData<duckdb::uhugeint_t>((Vector *)0x94802c);
  iVar2 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
  local_28 = uVar3.lower;
  puVar1[iVar2].lower = local_28;
  local_20 = uVar3.upper;
  puVar1[iVar2].upper = local_20;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}